

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_function_catalog_entry.cpp
# Opt level: O1

void __thiscall
duckdb::ScalarFunctionCatalogEntry::ScalarFunctionCatalogEntry
          (ScalarFunctionCatalogEntry *this,Catalog *catalog,SchemaCatalogEntry *schema,
          CreateScalarFunctionInfo *info)

{
  pointer pcVar1;
  
  FunctionEntry::FunctionEntry
            (&this->super_FunctionEntry,SCALAR_FUNCTION_ENTRY,catalog,schema,
             &info->super_CreateFunctionInfo);
  (this->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.
  _vptr_CatalogEntry = (_func_int **)&PTR__ScalarFunctionCatalogEntry_019bb320;
  (this->functions).super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p =
       (pointer)&(this->functions).super_FunctionSet<duckdb::ScalarFunction>.name.field_2;
  pcVar1 = (info->functions).super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->functions,pcVar1,
             pcVar1 + (info->functions).super_FunctionSet<duckdb::ScalarFunction>.name.
                      _M_string_length);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::vector
            (&(this->functions).super_FunctionSet<duckdb::ScalarFunction>.functions.
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &(info->functions).super_FunctionSet<duckdb::ScalarFunction>.functions.
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>);
  return;
}

Assistant:

ScalarFunctionCatalogEntry::ScalarFunctionCatalogEntry(Catalog &catalog, SchemaCatalogEntry &schema,
                                                       CreateScalarFunctionInfo &info)
    : FunctionEntry(CatalogType::SCALAR_FUNCTION_ENTRY, catalog, schema, info), functions(info.functions) {
}